

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::DepthDrawCase::~DepthDrawCase(DepthDrawCase *this)

{
  ~DepthDrawCase(this);
  operator_delete(this,200);
  return;
}

Assistant:

DepthDrawCase::~DepthDrawCase (void)
{
	deinit();
}